

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::deleteTrack(MidiFile *this,int aTrack)

{
  MidiEventList *this_00;
  value_type pMVar1;
  int iVar2;
  reference ppMVar3;
  int local_1c;
  int i;
  int length;
  int aTrack_local;
  MidiFile *this_local;
  
  iVar2 = getNumTracks(this);
  if (((-1 < aTrack) && (aTrack < iVar2)) && (iVar2 != 1)) {
    ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)aTrack);
    this_00 = *ppMVar3;
    local_1c = aTrack;
    if (this_00 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(this_00);
      operator_delete(this_00);
    }
    for (; local_1c < iVar2 + -1; local_1c = local_1c + 1) {
      ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)(local_1c + 1));
      pMVar1 = *ppMVar3;
      ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                          (&this->m_events,(long)local_1c);
      *ppMVar3 = pMVar1;
    }
    ppMVar3 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)(iVar2 + -1));
    *ppMVar3 = (value_type)0x0;
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
              (&this->m_events,(long)(iVar2 + -1));
  }
  return;
}

Assistant:

void MidiFile::deleteTrack(int aTrack) {
	int length = getNumTracks();
	if (aTrack < 0 || aTrack >= length) {
		return;
	}
	if (length == 1) {
		return;
	}
	delete m_events[aTrack];
	for (int i=aTrack; i<length-1; i++) {
		m_events[i] = m_events[i+1];
	}

	m_events[length-1] = NULL;
	m_events.resize(length-1);
}